

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int RunVar(undefined8 param_1,short param_2,undefined8 param_3,size_t param_4)

{
  uint uVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  initializer_list<bhf::ParameterOption> list;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  pointer ppVar7;
  type puVar8;
  void *pvVar9;
  uint *puVar10;
  ostream *poVar11;
  uchar *puVar12;
  char *__dest;
  size_type sVar13;
  short local_baa;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_b10;
  ParameterOption *local_ac8;
  allocator_type local_aa9;
  undefined1 local_aa8 [8];
  vector<char,_std::allocator<char>_> writeBuffer;
  stringstream local_a70 [8];
  stringstream stream_3;
  ostream local_a60 [376];
  string local_8e8 [32];
  stringstream local_8c8 [8];
  stringstream stream_2;
  ostream local_8b8 [376];
  string local_740 [32];
  stringstream local_720 [8];
  stringstream stream_1;
  ostream local_710 [376];
  long local_598;
  long status;
  uint32_t bytesRead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  AdsHandle handle;
  AdsDevice local_538 [8];
  AdsDevice device;
  unsigned_long size;
  string local_4d0 [32];
  stringstream local_4b0 [8];
  stringstream stream;
  ostream local_4a0 [376];
  _Self local_328;
  _Self local_320;
  const_iterator it;
  allocator local_2f1;
  string local_2f0 [32];
  undefined1 local_2d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_2aa;
  less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a9;
  int local_2a8 [6];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1c0;
  iterator local_198;
  size_type local_190;
  string local_188 [32];
  char *local_168;
  char *value;
  string local_158 [32];
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  allocator local_111;
  string local_110 [55];
  allocator local_d9;
  string local_d8 [32];
  ParameterOption *local_b8;
  ParameterOption local_b0;
  iterator local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  ParameterList params;
  Commandline *args_local;
  string *gw_local;
  uint16_t port_local;
  AmsNetId netid_local;
  
  local_b8 = &local_b0;
  params.map._M_t._M_impl.super__Rb_tree_header._M_node_count = param_4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"--type",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"",&local_111);
  bhf::ParameterOption::ParameterOption(&local_b0,(string *)local_d8,false,(string *)local_110);
  local_68 = &local_b0;
  local_60 = 1;
  list._M_len = 1;
  list._M_array = local_68;
  bhf::ParameterList::ParameterList((ParameterList *)local_58,list);
  local_ac8 = (ParameterOption *)&local_68;
  do {
    local_ac8 = local_ac8 + -1;
    bhf::ParameterOption::~ParameterOption(local_ac8);
  } while (local_ac8 != &local_b0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  bhf::Commandline::Parse
            ((ParameterList *)params.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar2 = params.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"Variable name is missing",(allocator *)((long)&value + 7))
  ;
  bhf::Commandline::Pop<std::__cxx11::string>((Commandline *)local_138,(string *)sVar2);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
  sVar2 = params.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string(local_188);
  pcVar6 = bhf::Commandline::Pop<char_const*>((string *)sVar2);
  std::__cxx11::string::~string(local_188);
  local_168 = pcVar6;
  if ((RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
       typeMap_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                                   ::typeMap_abi_cxx11_), iVar5 != 0)) {
    local_290 = &local_288;
    local_2a8[5] = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>(local_290,(char (*) [5])"BOOL",local_2a8 + 5);
    local_290 = &local_260;
    local_2a8[4] = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>(local_290,(char (*) [5])"BYTE",local_2a8 + 4);
    local_290 = &local_238;
    local_2a8[3] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>(local_290,(char (*) [5])0x1205a3,local_2a8 + 3);
    local_290 = &local_210;
    local_2a8[2] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[6],_int,_true>(local_290,(char (*) [6])"DWORD",local_2a8 + 2);
    local_290 = &local_1e8;
    local_2a8[1] = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[6],_int,_true>(local_290,(char (*) [6])"LWORD",local_2a8 + 1);
    local_290 = &local_1c0;
    local_2a8[0] = 0xff;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[7],_int,_true>(local_290,(char (*) [7])"STRING",local_2a8);
    local_198 = &local_288;
    local_190 = 6;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::allocator(&local_2aa);
    __l._M_len = local_190;
    __l._M_array = local_198;
    std::
    map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::map(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
           typeMap_abi_cxx11_,__l,&local_2a9,&local_2aa);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::~allocator(&local_2aa);
    local_b10 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                 *)&local_198;
    do {
      local_b10 = local_b10 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair(local_b10);
    } while (local_b10 != &local_288);
    __cxa_atexit(std::
                 map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::~map,&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                         ::typeMap_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                         ::typeMap_abi_cxx11_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"--type",&local_2f1);
  std::__cxx11::string::string((string *)&it);
  bhf::ParameterList::Get<std::__cxx11::string>
            ((ParameterList *)local_2d0,(string *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  local_320._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
               typeMap_abi_cxx11_,(key_type *)local_2d0);
  local_328._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
              typeMap_abi_cxx11_);
  bVar3 = std::operator==(&local_328,&local_320);
  if (bVar3) {
    std::__cxx11::stringstream::stringstream(local_4b0);
    poVar11 = std::operator<<(local_4a0,"RunVar");
    poVar11 = std::operator<<(poVar11,"(): Unknown TwinCAT type \'");
    poVar11 = std::operator<<(poVar11,(string *)local_2d0);
    std::operator<<(poVar11,"\'\n");
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_4d0);
    std::__cxx11::string::~string(local_4d0);
    std::__cxx11::stringstream::~stringstream(local_4b0);
    _port_local = 0xffffffff;
  }
  else {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator->(&local_320);
    sVar13 = ppVar7->second;
    local_baa = param_2;
    if (param_2 == 0) {
      local_baa = 0x353;
    }
    AdsDevice::AdsDevice
              (local_538,param_3,
               CONCAT26(handle._M_t.
                        super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
                        super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
                        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._6_2_,
                        (int6)param_1),local_baa);
    AdsDevice::GetHandle
              ((string *)
               &readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    if (local_168 == (char *)0x0) {
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&status + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead,sVar13,
                 (allocator<unsigned_char> *)((long)&status + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&status + 7));
      status._0_4_ = 0;
      puVar8 = std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::operator*
                         ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)
                          &readBuffer.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      uVar1 = *puVar8;
      pvVar9 = (void *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &bytesRead);
      puVar10 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &bytesRead);
      local_598 = AdsDevice::ReadReqEx2((uint)local_538,0xf005,(ulong)uVar1,pvVar9,puVar10);
      if (local_598 == 0) {
        switch((undefined4)status) {
        case 1:
          _port_local = PrintAs<unsigned_char>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &bytesRead);
          break;
        case 2:
          _port_local = PrintAs<unsigned_short>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &bytesRead);
          break;
        default:
          bhf::ForceBinaryOutputOnWindows();
          puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
          std::ostream::write((char *)&std::cout,(long)puVar12);
          bVar4 = std::ios::good();
          _port_local = (uint)((bVar4 ^ 0xff) & 1);
          break;
        case 4:
          _port_local = PrintAs<unsigned_int>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &bytesRead);
          break;
        case 8:
          _port_local = PrintAs<unsigned_long>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &bytesRead);
        }
      }
      else {
        std::__cxx11::stringstream::stringstream(local_720);
        poVar11 = std::operator<<(local_710,"RunVar");
        poVar11 = std::operator<<(poVar11,"(): failed with: 0x");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::hex);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_598);
        std::operator<<(poVar11,'\n');
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_740);
        std::__cxx11::string::~string(local_740);
        std::__cxx11::stringstream::~stringstream(local_720);
        _port_local = (uint)local_598;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_8c8);
      poVar11 = std::operator<<(local_8b8,"name>");
      poVar11 = std::operator<<(poVar11,(string *)local_138);
      poVar11 = std::operator<<(poVar11,"< value>");
      poVar11 = std::operator<<(poVar11,local_168);
      std::operator<<(poVar11,"<\n");
      std::__cxx11::stringstream::str();
      Logger::Log(0,local_8e8);
      std::__cxx11::string::~string(local_8e8);
      std::__cxx11::stringstream::~stringstream(local_8c8);
      std::__cxx11::stringstream::stringstream(local_a70);
      poVar11 = std::operator<<(local_a60,"size>");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,sVar13);
      poVar11 = std::operator<<(poVar11,"< value>");
      poVar11 = std::operator<<(poVar11,local_168);
      std::operator<<(poVar11,"<\n");
      std::__cxx11::stringstream::str();
      Logger::Log(0,(string *)
                    &writeBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
      ;
      std::__cxx11::string::~string
                ((string *)
                 &writeBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::stringstream::~stringstream(local_a70);
      switch(sVar13) {
      case 1:
        _port_local = Write<unsigned_char>
                                (local_538,
                                 (AdsHandle *)
                                 &readBuffer.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_168);
        break;
      case 2:
        _port_local = Write<unsigned_short>
                                (local_538,
                                 (AdsHandle *)
                                 &readBuffer.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_168);
        break;
      default:
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_aa8,sVar13,&local_aa9);
        std::allocator<char>::~allocator(&local_aa9);
        __dest = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)local_aa8);
        pcVar6 = local_168;
        sVar13 = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)local_aa8);
        strncpy(__dest,pcVar6,sVar13);
        puVar8 = std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::operator*
                           ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)
                            &readBuffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar1 = *puVar8;
        pvVar9 = (void *)std::vector<char,_std::allocator<char>_>::size
                                   ((vector<char,_std::allocator<char>_> *)local_aa8);
        std::vector<char,_std::allocator<char>_>::data
                  ((vector<char,_std::allocator<char>_> *)local_aa8);
        _port_local = AdsDevice::WriteReqEx((uint)local_538,0xf005,(ulong)uVar1,pvVar9);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_aa8);
        break;
      case 4:
        _port_local = Write<unsigned_int>(local_538,
                                          (AdsHandle *)
                                          &readBuffer.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          local_168);
        break;
      case 8:
        _port_local = Write<unsigned_long>
                                (local_538,
                                 (AdsHandle *)
                                 &readBuffer.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_168);
      }
    }
    std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
              ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)
               &readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    AdsDevice::~AdsDevice(local_538);
  }
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)local_138);
  bhf::ParameterList::~ParameterList((ParameterList *)local_58);
  return _port_local;
}

Assistant:

int RunVar(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    bhf::ParameterList params = {
        {"--type"},
    };
    args.Parse(params);

    const auto name = args.Pop<std::string>("Variable name is missing");
    const auto value = args.Pop<const char*>();
    static const std::map<const std::string, size_t> typeMap = {
        {"BOOL", 1},
        {"BYTE", 1},
        {"WORD", 2},
        {"DWORD", 4},
        {"LWORD", 8},
        {"STRING", 255},
    };
    const auto type = params.Get<std::string>("--type");
    const auto it = typeMap.find(type);
    if (typeMap.end() == it) {
        LOG_ERROR(__FUNCTION__ << "(): Unknown TwinCAT type '" << type << "'\n");
        return -1;
    }
    const auto size = it->second;

    auto device = AdsDevice { gw, netid, port ? port : uint16_t(AMSPORT_R0_PLC_TC3) };
    const auto handle = device.GetHandle(name);

    if (!value) {
        std::vector<uint8_t> readBuffer(size);
        uint32_t bytesRead = 0;
        const auto status = device.ReadReqEx2(ADSIGRP_SYM_VALBYHND,
                                              *handle,
                                              readBuffer.size(),
                                              readBuffer.data(),
                                              &bytesRead);
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return status;
        }

        switch (bytesRead) {
        case sizeof(uint8_t):
            return PrintAs<uint8_t>(readBuffer);

        case sizeof(uint16_t):
            return PrintAs<uint16_t>(readBuffer);

        case sizeof(uint32_t):
            return PrintAs<uint32_t>(readBuffer);

        case sizeof(uint64_t):
            return PrintAs<uint64_t>(readBuffer);

        default:
            bhf::ForceBinaryOutputOnWindows();
            std::cout.write((const char*)readBuffer.data(), bytesRead);
            return !std::cout.good();
        }
    }

    LOG_VERBOSE("name>" << name << "< value>" << value << "<\n");
    LOG_VERBOSE("size>" << size << "< value>" << value << "<\n");

    switch (size) {
    case sizeof(uint8_t):
        return Write<uint8_t>(device, handle, value);

    case sizeof(uint16_t):
        return Write<uint16_t>(device, handle, value);

    case sizeof(uint32_t):
        return Write<uint32_t>(device, handle, value);

    case sizeof(uint64_t):
        return Write<uint64_t>(device, handle, value);

    default:
        {
            auto writeBuffer = std::vector<char>(size);
            strncpy(writeBuffer.data(), value, writeBuffer.size());
            return device.WriteReqEx(ADSIGRP_SYM_VALBYHND,
                                     *handle,
                                     writeBuffer.size(),
                                     writeBuffer.data());
        }
    }
}